

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall
helics::CoreBroker::globalError(CoreBroker *this,int32_t errorCode,string_view errorString)

{
  size_t size;
  ActionMessage error;
  ActionMessage local_e0;
  
  size = errorString._M_len;
  ActionMessage::ActionMessage(&local_e0,cmd_global_error);
  local_e0.source_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
  local_e0.messageID = errorCode;
  local_e0.payload.bufferSize = size;
  if ((local_e0.payload.heap != (byte *)errorString._M_str) &&
     (SmallBuffer::reserve(&local_e0.payload,size), size != 0)) {
    memcpy(local_e0.payload.heap,errorString._M_str,size);
  }
  BrokerBase::addActionMessage(&this->super_BrokerBase,&local_e0);
  ActionMessage::~ActionMessage(&local_e0);
  return;
}

Assistant:

void CoreBroker::globalError(int32_t errorCode, std::string_view errorString)
{
    ActionMessage error(CMD_GLOBAL_ERROR);
    error.source_id = getGlobalId();
    error.messageID = errorCode;
    error.payload = errorString;
    addActionMessage(error);
}